

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Vec_Ptr_t * Abc_CutFactor(Abc_Obj_t *pNode)

{
  int iVar1;
  Vec_Ptr_t *vLeaves_00;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vLeaves;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsCi(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsCi(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                  ,0x819,"Vec_Ptr_t *Abc_CutFactor(Abc_Obj_t *)");
  }
  vLeaves_00 = Vec_PtrAlloc(10);
  pAVar2 = Abc_ObjFanin0(pNode);
  Abc_CutFactor_rec(pAVar2,vLeaves_00);
  pAVar2 = Abc_ObjFanin1(pNode);
  Abc_CutFactor_rec(pAVar2,vLeaves_00);
  for (local_24 = 0; iVar1 = Vec_PtrSize(vLeaves_00), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar3 = Vec_PtrEntry(vLeaves_00,local_24);
    *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffef;
  }
  return vLeaves_00;
}

Assistant:

Vec_Ptr_t * Abc_CutFactor( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vLeaves;
    Abc_Obj_t * pObj;
    int i;
    assert( !Abc_ObjIsCi(pNode) );
    vLeaves  = Vec_PtrAlloc( 10 );
    Abc_CutFactor_rec( Abc_ObjFanin0(pNode), vLeaves );
    Abc_CutFactor_rec( Abc_ObjFanin1(pNode), vLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkA = 0;
    return vLeaves;
}